

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_> * __thiscall
cmGeneratorTarget::GetSourceFilesWithoutObjectLibraries
          (vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_> *__return_storage_ptr__,
          cmGeneratorTarget *this,string *config)

{
  pointer pSVar1;
  size_type sVar2;
  KindedSources *pKVar3;
  SourceAndKind *si;
  pointer __x;
  string sStack_48;
  
  (__return_storage_ptr__->
  super__Vector_base<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pKVar3 = GetKindedSources(this,config);
  std::vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>::reserve
            (__return_storage_ptr__,
             (long)(pKVar3->Sources).
                   super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pKVar3->Sources).
                   super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
  pSVar1 = (pKVar3->Sources).
           super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__x = (pKVar3->Sources).
             super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
             ._M_impl.super__Vector_impl_data._M_start; __x != pSVar1; __x = __x + 1) {
    cmSourceFile::GetObjectLibrary_abi_cxx11_(&sStack_48,(__x->Source).Value);
    sVar2 = sStack_48._M_string_length;
    std::__cxx11::string::~string((string *)&sStack_48);
    if (sVar2 == 0) {
      std::vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>::push_back
                (__return_storage_ptr__,&__x->Source);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<BT<cmSourceFile*>>
cmGeneratorTarget::GetSourceFilesWithoutObjectLibraries(
  std::string const& config) const
{
  std::vector<BT<cmSourceFile*>> files;
  KindedSources const& kinded = this->GetKindedSources(config);
  files.reserve(kinded.Sources.size());
  for (SourceAndKind const& si : kinded.Sources) {
    if (si.Source.Value->GetObjectLibrary().empty()) {
      files.push_back(si.Source);
    }
  }
  return files;
}